

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<false>>
           *this,undefined8 *state,long *next)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  bool bVar9;
  
  uVar1 = *state;
  uVar7 = *(uint *)(this + 0x28);
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    uVar5 = 0;
    do {
      pcVar6 = *(char **)this;
      pcVar2 = *(char **)(this + 0x20);
      bVar9 = pcVar6 == pcVar2;
      if (!bVar9) {
        pcVar3 = (char *)*state;
        bVar9 = false;
        pcVar8 = pcVar3;
        do {
          if (pcVar8 == (char *)state[4]) {
            *(undefined1 *)((long)state + 0x31) = 1;
LAB_00130e52:
            *state = pcVar3;
            break;
          }
          if (*pcVar8 != *pcVar6) goto LAB_00130e52;
          pcVar6 = pcVar6 + 1;
          pcVar8 = pcVar8 + 1;
          *state = pcVar8;
          bVar9 = pcVar6 == pcVar2;
        } while (!bVar9);
      }
      if (!bVar9) goto LAB_00130ec4;
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar7);
  }
  do {
    cVar4 = (**(code **)(*next + 0x10))(next,state);
    if (cVar4 != '\0') {
      return true;
    }
    if (*(uint *)(this + 0x2c) <= uVar7) break;
    pcVar6 = *(char **)this;
    pcVar2 = *(char **)(this + 0x20);
    bVar9 = pcVar6 == pcVar2;
    if (!bVar9) {
      pcVar3 = (char *)*state;
      bVar9 = false;
      pcVar8 = pcVar3;
      do {
        if (pcVar8 == (char *)state[4]) {
          *(undefined1 *)((long)state + 0x31) = 1;
LAB_00130eba:
          *state = pcVar3;
          break;
        }
        if (*pcVar8 != *pcVar6) goto LAB_00130eba;
        pcVar6 = pcVar6 + 1;
        pcVar8 = pcVar8 + 1;
        *state = pcVar8;
        bVar9 = pcVar6 == pcVar2;
      } while (!bVar9);
    }
    uVar7 = uVar7 + 1;
  } while (bVar9);
LAB_00130ec4:
  *state = uVar1;
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }